

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::GenerateFastLdElemI(Lowerer *this,Instr **ldElem,bool *instrIsInHelperBlockRef)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  ValueType valueType;
  OpCode opcode;
  BailOutKind BVar6;
  BailOutKind BVar7;
  uint uVar8;
  uint uVar9;
  uint32 uVar10;
  uint uVar11;
  undefined4 *puVar12;
  RegOpnd *pRVar13;
  Opnd *pOVar14;
  IndirOpnd *pIVar15;
  JITTimeFunctionBody *pJVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  char16 *pcVar19;
  IntConstOpnd *pIVar20;
  BailOutInfo *pBVar21;
  BranchInstr *instr_00;
  ProfiledInstr *pPVar22;
  Instr *pIVar23;
  HelperCallOpnd *newSrc;
  char16_t *pcVar24;
  LabelInstr *local_590;
  bool local_57c;
  byte local_57a;
  bool local_579;
  RegOpnd *local_490;
  RegOpnd *local_450;
  RegOpnd *local_430;
  bool local_35a;
  bool local_359;
  Instr *instrHelper;
  JnHelperMethod local_340;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_33c;
  undefined1 local_339;
  JnHelperMethod helperMethod;
  bool hasBeenUndefined;
  Instr *insertBeforeInstr;
  wchar local_328 [3];
  bool needObjectTest;
  char16 debugStringBuffer_1 [42];
  char local_2c8 [8];
  char baseValueTypeStr [256];
  Instr *instr_2;
  Instr *instrMov;
  Instr *instr_1;
  Instr *instr;
  AutoReuseOpnd autoReuseReg32;
  RegOpnd *reg32;
  AutoReuseOpnd autoReuseReg;
  RegOpnd *reg;
  Instr *instrSink;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_13a;
  undefined1 local_138 [6];
  ValueType baseValueType;
  AutoReuseOpnd autoReuseIndirOpnd;
  IntConstOpnd *constOpnd_1;
  char16 debugStringBuffer [42];
  Opnd *constOpnd;
  Opnd *undefinedOpnd;
  BailOutKind bailOutKind;
  bool bailoutForOpndOverflow;
  IRType dstType;
  Opnd *dst;
  Opnd *maskOpnd;
  bool indirOpndOverflowed;
  bool isStringIndex;
  bool isTypedArrayElement;
  LabelInstr *pLStack_90;
  FldInfoFlags flags;
  LabelInstr *labelCantUseArray;
  byte local_80;
  byte local_7f;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_7e;
  bool local_7b;
  anon_union_2_4_ea848c7b_for_ValueType_13 aStack_7a;
  bool emitBailout;
  bool emittedFastPath;
  bool needMissingValueCheck;
  bool isNativeArrayLoad;
  IndirOpnd *indirOpnd;
  Opnd *src1;
  LabelInstr *labelMissingNative;
  LabelInstr *labelBailOut;
  LabelInstr *labelFallThru;
  LabelInstr *labelHelper;
  bool *instrIsInHelperBlock;
  bool *instrIsInHelperBlockRef_local;
  Instr **ldElem_local;
  Lowerer *this_local;
  
  instrIsInHelperBlock = instrIsInHelperBlockRef;
  instrIsInHelperBlockRef_local = (bool *)ldElem;
  ldElem_local = (Instr **)this;
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x46fa,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  labelHelper = (LabelInstr *)instrIsInHelperBlock;
  *instrIsInHelperBlock = false;
  labelMissingNative = (LabelInstr *)0x0;
  src1 = (Opnd *)0x0;
  indirOpnd = (IndirOpnd *)IR::Instr::GetSrc1(*(Instr **)instrIsInHelperBlockRef_local);
  bVar3 = IR::Opnd::IsIndirOpnd((Opnd *)indirOpnd);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4704,"(src1->IsIndirOpnd())","Expected indirOpnd on LdElementI");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  _emittedFastPath = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
  local_359 = false;
  if (*(short *)(*(long *)instrIsInHelperBlockRef_local + 0x30) == 0x99) {
    pRVar13 = IR::IndirOpnd::GetBaseOpnd(_emittedFastPath);
    aStack_7a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRVar13->super_Opnd);
    local_359 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&stack0xffffffffffffff86);
  }
  if (local_359 != false) {
    return true;
  }
  labelBailOut = IR::Instr::GetOrCreateContinueLabel(*(Instr **)instrIsInHelperBlockRef_local,false)
  ;
  labelFallThru = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = IR::Instr::DoStackArgsOpt(*(Instr **)instrIsInHelperBlockRef_local);
  local_35a = false;
  if (!bVar3) {
    pRVar13 = IR::IndirOpnd::GetBaseOpnd(_emittedFastPath);
    local_7e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(&pRVar13->super_Opnd);
    local_35a = ValueType::IsLikelyNativeArray((ValueType *)&local_7e.field_0);
  }
  local_7b = local_35a;
  local_7f = 1;
  local_80 = 0;
  labelCantUseArray._7_1_ = 0;
  bVar3 = IR::Instr::DoStackArgsOpt(*(Instr **)instrIsInHelperBlockRef_local);
  if (bVar3) {
    local_80 = GenerateFastArgumentsLdElemI
                         (this,*(Instr **)instrIsInHelperBlockRef_local,labelBailOut);
    labelCantUseArray._7_1_ = 1;
    goto LAB_007a496e;
  }
  bVar3 = GenerateFastStringLdElem
                    (this,*(Instr **)instrIsInHelperBlockRef_local,labelFallThru,labelBailOut);
  if (bVar3) {
    local_80 = 1;
    goto LAB_007a496e;
  }
  pLStack_90 = labelFallThru;
  if ((local_7b & 1U) != 0) {
    pOVar14 = IR::Instr::GetDst(*(Instr **)instrIsInHelperBlockRef_local);
    IVar4 = IR::Opnd::GetType(pOVar14);
    if (IVar4 == TyVar) {
      return true;
    }
    bVar3 = IR::Instr::IsProfiledInstr(*(Instr **)instrIsInHelperBlockRef_local);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4742,"(ldElem->IsProfiledInstr())","ldElem->IsProfiledInstr()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    pLStack_90 = IR::LabelInstr::New(Label,this->m_func,true);
    labelMissingNative = pLStack_90;
  }
  maskOpnd._7_1_ = FldInfo_NoInfo;
  bVar3 = IR::Instr::IsProfiledInstr(*(Instr **)instrIsInHelperBlockRef_local);
  if (bVar3) {
    pPVar22 = IR::Instr::AsProfiledInstr(*(Instr **)instrIsInHelperBlockRef_local);
    maskOpnd._7_1_ = ((pPVar22->u).ldElemInfo)->flags;
  }
  maskOpnd._4_1_ = 0;
  dst = (Opnd *)0x0;
  pIVar23 = *(Instr **)instrIsInHelperBlockRef_local;
  pIVar15 = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
  _emittedFastPath =
       GenerateFastElemICommon
                 (this,pIVar23,false,pIVar15,labelFallThru,pLStack_90,labelBailOut,
                  (bool *)((long)&maskOpnd + 6),(bool *)((long)&maskOpnd + 5),
                  (bool *)((long)&labelCantUseArray + 7),&dst,(LabelInstr **)0x0,true,false,false,
                  (LabelInstr *)0x0,(bool *)((long)&maskOpnd + 4),maskOpnd._7_1_);
  _bailOutKind = IR::Instr::GetDst(*(Instr **)instrIsInHelperBlockRef_local);
  pRVar13 = IR::Opnd::AsRegOpnd(_bailOutKind);
  IVar4 = IR::Opnd::GetType(&pRVar13->super_Opnd);
  if (_emittedFastPath == (IndirOpnd *)0x0) {
    bVar3 = IR::Instr::HasBailOutInfo(*(Instr **)instrIsInHelperBlockRef_local);
    if (bVar3) {
      BVar6 = IR::Instr::GetBailOutKind(*(Instr **)instrIsInHelperBlockRef_local);
      BVar6 = IR::operator&(BVar6,BailOutOnArrayAccessHelperCall);
      if ((BVar6 != BailOutInvalid) && ((maskOpnd._4_1_ & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4769,
                           "(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed)"
                           ,
                           "!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
    }
    if (((maskOpnd._4_1_ & 1) == 0) ||
       (bVar3 = IR::Instr::HasBailOutInfo(*(Instr **)instrIsInHelperBlockRef_local), !bVar3)) {
      bVar3 = IR::Opnd::IsVar(_bailOutKind);
      if (bVar3) {
        uVar8 = Func::GetSourceContextId(this->m_func);
        uVar9 = Func::GetLocalFunctionId(this->m_func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar8,uVar9);
        if (bVar3) {
          uVar8 = Func::GetSourceContextId(this->m_func);
          uVar9 = Func::GetLocalFunctionId(this->m_func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LowererPhase,uVar8,uVar9);
          if (bVar3) {
            pJVar16 = Func::GetJITFunctionBody(this->m_func);
            pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
            pcVar18 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])&constOpnd_1);
            pcVar19 = Js::OpCodeUtil::GetOpCodeName
                                (*(OpCode *)(*(long *)instrIsInHelperBlockRef_local + 0x30));
            Output::Print(L"Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"
                          ,pcVar17,pcVar18,pcVar19);
            Output::Flush();
          }
        }
        return true;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x47af,"(false)",
                         "Global optimizer shouldn\'t have specialized this instruction.");
      if (bVar3) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
        bVar3 = IR::Opnd::IsRegOpnd(_bailOutKind);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x47b0,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pIVar20 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
        InsertMove(_bailOutKind,&pIVar20->super_Opnd,*(Instr **)instrIsInHelperBlockRef_local,true);
        IR::Instr::FreeSrc1(*(Instr **)instrIsInHelperBlockRef_local);
        IR::Instr::FreeDst(*(Instr **)instrIsInHelperBlockRef_local);
        GenerateBailOut(this,*(Instr **)instrIsInHelperBlockRef_local,(BranchInstr *)0x0,
                        (LabelInstr *)0x0,(LabelInstr *)0x0);
        return false;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    undefinedOpnd._6_1_ = false;
    BVar6 = IR::Instr::GetBailOutKind(*(Instr **)instrIsInHelperBlockRef_local);
    BVar7 = IR::operator~(BailOutKindBits);
    BVar7 = IR::operator&(BVar6,BVar7);
    if (BVar7 == BailOutConventionalTypedArrayAccessOnly) {
      bVar3 = IR::Opnd::IsVar(_bailOutKind);
      if (bVar3) {
        pOVar14 = LoadLibraryValueOpnd(this,*(Instr **)instrIsInHelperBlockRef_local,ValueUndefined)
        ;
        InsertMove(_bailOutKind,pOVar14,*(Instr **)instrIsInHelperBlockRef_local,true);
        IR::Instr::FreeSrc1(*(Instr **)instrIsInHelperBlockRef_local);
        IR::Instr::FreeDst(*(Instr **)instrIsInHelperBlockRef_local);
        IR::Instr::Remove(*(Instr **)instrIsInHelperBlockRef_local);
        local_80 = 1;
      }
      undefinedOpnd._6_1_ = !bVar3;
    }
    if (!undefinedOpnd._6_1_) {
      BVar7 = IR::operator|(BailOutConventionalNativeArrayAccessOnly,BailOutOnArrayAccessHelperCall)
      ;
      BVar6 = IR::operator&(BVar6,BVar7);
      if (BVar6 == BailOutInvalid) goto LAB_007a33dd;
    }
    stack0xffffffffffffff40 = (IntConstOpnd *)0x0;
    bVar3 = IR::Opnd::IsFloat(_bailOutKind);
    if (bVar3) {
      register0x00000000 =
           (IntConstOpnd *)IR::FloatConstOpnd::New(Js::NumberConstants::NaN,TyFloat64,this->m_func);
    }
    else {
      register0x00000000 = IR::IntConstOpnd::New(0,TyInt32,this->m_func,true);
    }
    InsertMove(_bailOutKind,&stack0xffffffffffffff40->super_Opnd,
               *(Instr **)instrIsInHelperBlockRef_local,true);
    IR::Instr::FreeSrc1(*(Instr **)instrIsInHelperBlockRef_local);
    IR::Instr::FreeDst(*(Instr **)instrIsInHelperBlockRef_local);
    GenerateBailOut(this,*(Instr **)instrIsInHelperBlockRef_local,(BranchInstr *)0x0,
                    (LabelInstr *)0x0,(LabelInstr *)0x0);
    local_80 = 1;
LAB_007a33dd:
    return (bool)((local_80 ^ 0xff) & 1);
  }
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_138,&_emittedFastPath->super_Opnd,this->m_func,true);
  pIVar15 = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
  pRVar13 = IR::IndirOpnd::GetBaseOpnd(pIVar15);
  local_13a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRVar13->super_Opnd);
  bVar3 = IR::Instr::HasBailOutInfo(*(Instr **)instrIsInHelperBlockRef_local);
  if ((bVar3) &&
     (uVar10 = IR::Instr::GetByteCodeOffset(*(Instr **)instrIsInHelperBlockRef_local),
     uVar10 != 0xffffffff)) {
    pBVar21 = IR::Instr::GetBailOutInfo(*(Instr **)instrIsInHelperBlockRef_local);
    uVar11 = pBVar21->bailOutOffset;
    uVar10 = IR::Instr::GetByteCodeOffset(*(Instr **)instrIsInHelperBlockRef_local);
    if (uVar10 < uVar11) goto LAB_007a37e1;
    pIVar15 = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
    pRVar13 = IR::IndirOpnd::GetBaseOpnd(pIVar15);
    bVar3 = IR::Opnd::IsEqual(_bailOutKind,&pRVar13->super_Opnd);
    if (!bVar3) goto LAB_007a37e1;
LAB_007a3878:
    pIVar23 = IR::Instr::SinkDst(*(Instr **)instrIsInHelperBlockRef_local,Ld_A,RegNOREG,(Instr *)0x0
                                );
    IR::Instr::Unlink(pIVar23);
    IR::Instr::InsertAfter(&labelBailOut->super_Instr,pIVar23);
    LowererMD::ChangeToAssign(pIVar23);
    _bailOutKind = IR::Instr::GetDst(*(Instr **)instrIsInHelperBlockRef_local);
  }
  else {
LAB_007a37e1:
    pIVar15 = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
    pRVar13 = IR::IndirOpnd::GetIndexOpnd(pIVar15);
    if (pRVar13 != (RegOpnd *)0x0) {
      pIVar15 = IR::Opnd::AsIndirOpnd(&indirOpnd->super_Opnd);
      pRVar13 = IR::IndirOpnd::GetIndexOpnd(pIVar15);
      bVar3 = IR::Opnd::IsEqual(_bailOutKind,&pRVar13->super_Opnd);
      if (bVar3) goto LAB_007a3878;
    }
  }
  if ((maskOpnd._6_1_ & 1) == 0) {
    InsertMove(_bailOutKind,&_emittedFastPath->super_Opnd,*(Instr **)instrIsInHelperBlockRef_local,
               true);
    if (dst != (Opnd *)0x0) {
      uVar11 = IR::Opnd::GetSize(dst);
      IVar4 = IR::Opnd::GetType(_bailOutKind);
      pOVar14 = dst;
      if (uVar11 != IVar4) {
        IVar4 = IR::Opnd::GetType(_bailOutKind);
        pOVar14 = IR::Opnd::UseWithNewType(pOVar14,IVar4,this->m_func);
        dst = &IR::Opnd::AsRegOpnd(pOVar14)->super_Opnd;
      }
      InsertAnd(_bailOutKind,_bailOutKind,dst,*(Instr **)instrIsInHelperBlockRef_local);
    }
    local_579 = false;
    if (((maskOpnd._5_1_ & 1) == 0) && (local_579 = false, (local_7b & 1U) == 0)) {
      local_579 = *(short *)(*(long *)instrIsInHelperBlockRef_local + 0x30) == 0x99;
    }
    insertBeforeInstr._7_1_ = local_579;
    local_57a = 0;
    if ((maskOpnd._5_1_ & 1) == 0) {
      bVar3 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_13a.field_0);
      local_57c = false;
      if (bVar3) {
        local_57c = ValueType::HasNoMissingValues((ValueType *)&local_13a.field_0);
      }
      local_57a = local_57c ^ 0xff;
    }
    local_7f = local_57a & 1;
    if (local_7f != 0) {
      opcode = BrNeq_A;
      if ((insertBeforeInstr._7_1_ & 1) != 0) {
        opcode = BrEq_A;
      }
      if ((insertBeforeInstr._7_1_ & 1) == 0) {
        local_590 = labelBailOut;
      }
      else {
        local_590 = labelFallThru;
      }
      InsertMissingItemCompareBranch
                (this,_bailOutKind,opcode,local_590,*(Instr **)instrIsInHelperBlockRef_local);
      if ((local_7b & 1U) != 0) {
        if ((insertBeforeInstr._7_1_ & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x489e,"(!needObjectTest)","!needObjectTest");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        if (labelFallThru == labelMissingNative) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x489f,"(labelHelper != labelBailOut)","labelHelper != labelBailOut");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        pPVar22 = IR::Instr::AsProfiledInstr(*(Instr **)instrIsInHelperBlockRef_local);
        insertBeforeInstr._4_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             Js::LdElemInfo::GetElementType((pPVar22->u).ldElemInfo);
        bVar3 = ValueType::HasBeenUndefined((ValueType *)((long)&insertBeforeInstr + 4));
        if (bVar3) {
          src1 = (Opnd *)IR::LabelInstr::New(Label,this->m_func,true);
          InsertBranch(Br,(LabelInstr *)src1,*(Instr **)instrIsInHelperBlockRef_local);
        }
        else {
          InsertBranch(Br,labelMissingNative,*(Instr **)instrIsInHelperBlockRef_local);
        }
      }
    }
    if ((insertBeforeInstr._7_1_ & 1) == 0) {
      if ((local_7f & 1) == 0) {
        InsertBranch(Br,labelBailOut,*(Instr **)instrIsInHelperBlockRef_local);
      }
    }
    else {
      LowererMD::GenerateObjectTest
                (&this->m_lowererMD,_bailOutKind,*(Instr **)instrIsInHelperBlockRef_local,
                 labelBailOut,true);
    }
    local_80 = 1;
  }
  else {
    IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&reg32);
    bVar3 = IR::Opnd::IsRegOpnd(_bailOutKind);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x47df,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    bVar3 = IR::Opnd::IsFloat(&_emittedFastPath->super_Opnd);
    if (bVar3) {
      if ((IVar4 != TyFloat64) && (IVar4 != TyVar)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x47e3,"((dstType == TyFloat64) || (dstType == TyVar))",
                           "For Float32Array LdElemI\'s dst should be specialized to TyFloat64 or not at all."
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar3 = IR::Opnd::IsFloat32(&_emittedFastPath->super_Opnd);
      if (bVar3) {
        autoReuseReg32._16_8_ = IR::RegOpnd::New(TyFloat32,this->m_func);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&instr,(Opnd *)autoReuseReg32._16_8_,this->m_func,true);
        InsertMove((Opnd *)autoReuseReg32._16_8_,&_emittedFastPath->super_Opnd,
                   *(Instr **)instrIsInHelperBlockRef_local,true);
        if (IVar4 == TyFloat64) {
          local_430 = IR::Opnd::AsRegOpnd(_bailOutKind);
        }
        else {
          local_430 = IR::RegOpnd::New(TyFloat64,this->m_func);
        }
        autoReuseReg._16_8_ = local_430;
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&reg32,&local_430->super_Opnd,this->m_func,true);
        InsertConvertFloat32ToFloat64
                  ((Opnd *)autoReuseReg._16_8_,(Opnd *)autoReuseReg32._16_8_,
                   *(Instr **)instrIsInHelperBlockRef_local);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&instr);
      }
      else {
        bVar3 = IR::Opnd::IsFloat64(&_emittedFastPath->super_Opnd);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x47f3,"(indirOpnd->IsFloat64())","indirOpnd->IsFloat64()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
        if (IVar4 == TyFloat64) {
          local_450 = IR::Opnd::AsRegOpnd(_bailOutKind);
        }
        else {
          local_450 = IR::RegOpnd::New(TyFloat64,this->m_func);
        }
        autoReuseReg._16_8_ = local_450;
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&reg32,&local_450->super_Opnd,this->m_func,true);
        InsertMove((Opnd *)autoReuseReg._16_8_,&_emittedFastPath->super_Opnd,
                   *(Instr **)instrIsInHelperBlockRef_local,true);
      }
      if (IVar4 != TyFloat64) {
        pRVar13 = IR::Opnd::AsRegOpnd(_bailOutKind);
        LowererMD::SaveDoubleToVar
                  (&this->m_lowererMD,pRVar13,(RegOpnd *)autoReuseReg._16_8_,
                   *(Instr **)instrIsInHelperBlockRef_local,*(Instr **)instrIsInHelperBlockRef_local
                   ,false);
      }
      pIVar23 = IR::Instr::New(UCOMISD,this->m_func);
      IR::Instr::SetSrc1(pIVar23,(Opnd *)autoReuseReg._16_8_);
      IR::Instr::SetSrc2(pIVar23,(Opnd *)autoReuseReg._16_8_);
      IR::Instr::InsertBefore(*(Instr **)instrIsInHelperBlockRef_local,pIVar23);
      instr_00 = IR::BranchInstr::New(JP,labelFallThru,this->m_func);
      IR::Instr::InsertBefore(*(Instr **)instrIsInHelperBlockRef_local,&instr_00->super_Instr);
      if (IVar4 == TyFloat64) {
        labelCantUseArray._7_1_ = 1;
      }
    }
    else {
      if ((IVar4 != TyInt32) && (IVar4 != TyVar)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x482a,"((dstType == TyInt32) || (dstType == TyVar))",
                           "For Int/UintArray LdElemI\'s dst should be specialized to TyInt32 or not at all."
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      if (IVar4 == TyInt32) {
        local_490 = IR::Opnd::AsRegOpnd(_bailOutKind);
      }
      else {
        local_490 = IR::RegOpnd::New(TyInt32,this->m_func);
      }
      autoReuseReg._16_8_ = local_490;
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&reg32,&local_490->super_Opnd,this->m_func,true);
      IVar5 = IR::Opnd::GetType(&_emittedFastPath->super_Opnd);
      uVar2 = autoReuseReg._16_8_;
      if (IVar5 != TyUint32) {
        valueType = ValueType::GetTaggedInt();
        IR::Opnd::SetValueType((Opnd *)uVar2,valueType);
      }
      instr_2 = InsertMove((Opnd *)autoReuseReg._16_8_,&_emittedFastPath->super_Opnd,
                           *(Instr **)instrIsInHelperBlockRef_local,true);
      if (dst != (Opnd *)0x0) {
        uVar11 = IR::Opnd::GetSize(dst);
        IVar5 = IR::Opnd::GetType((Opnd *)autoReuseReg._16_8_);
        pOVar14 = dst;
        if (uVar11 != IVar5) {
          IVar5 = IR::Opnd::GetType((Opnd *)autoReuseReg._16_8_);
          pOVar14 = IR::Opnd::UseWithNewType(pOVar14,IVar5,this->m_func);
          dst = &IR::Opnd::AsRegOpnd(pOVar14)->super_Opnd;
        }
        instr_2 = InsertAnd((Opnd *)autoReuseReg._16_8_,(Opnd *)autoReuseReg._16_8_,dst,
                            *(Instr **)instrIsInHelperBlockRef_local);
      }
      if (IVar4 == TyInt32) {
        *(ushort *)&instr_2->field_0x36 =
             *(ushort *)&instr_2->field_0x36 & 0xfffd |
             *(ushort *)(*(long *)instrIsInHelperBlockRef_local + 0x36) & 2;
        *(ushort *)&instr_2->field_0x36 =
             *(ushort *)&instr_2->field_0x36 & 0xfffb |
             *(ushort *)(*(long *)instrIsInHelperBlockRef_local + 0x36) & 4;
        IVar4 = IR::Opnd::GetType(&_emittedFastPath->super_Opnd);
        uVar2 = autoReuseReg._16_8_;
        if (IVar4 == TyUint32) {
          pIVar20 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
          InsertCompareBranch(this,(Opnd *)uVar2,&pIVar20->super_Opnd,BrLt_A,labelFallThru,
                              *(Instr **)instrIsInHelperBlockRef_local,false);
        }
        labelCantUseArray._7_1_ = 1;
      }
      else {
        pIVar23 = IR::Instr::New(ToVar,_bailOutKind,(Opnd *)autoReuseReg._16_8_,this->m_func);
        *(ushort *)&pIVar23->field_0x36 =
             *(ushort *)&pIVar23->field_0x36 & 0xfffd |
             *(ushort *)(*(long *)instrIsInHelperBlockRef_local + 0x36) & 2;
        *(ushort *)&pIVar23->field_0x36 =
             *(ushort *)&pIVar23->field_0x36 & 0xfffb |
             *(ushort *)(*(long *)instrIsInHelperBlockRef_local + 0x36) & 4;
        IR::Instr::InsertBefore(*(Instr **)instrIsInHelperBlockRef_local,pIVar23);
        IVar4 = IR::Opnd::GetType(&_emittedFastPath->super_Opnd);
        LowererMD::EmitLoadVar(&this->m_lowererMD,pIVar23,IVar4 == TyUint32,false);
      }
    }
    InsertBranch(Br,labelBailOut,*(Instr **)instrIsInHelperBlockRef_local);
    local_80 = 1;
    uVar8 = Func::GetSourceContextId(this->m_func);
    uVar9 = Func::GetLocalFunctionId(this->m_func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TypedArrayTypeSpecPhase,uVar8,uVar9);
    if (bVar3) {
      uVar8 = Func::GetSourceContextId(this->m_func);
      uVar9 = Func::GetLocalFunctionId(this->m_func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,LowererPhase,uVar8,uVar9);
      if (bVar3) {
        ValueType::ToString((ValueType *)&local_13a.field_0,(char (*) [256])local_2c8);
        pJVar16 = Func::GetJITFunctionBody(this->m_func);
        pcVar17 = JITTimeFunctionBody::GetDisplayName(pJVar16);
        pcVar18 = Func::GetDebugNumberSet(this->m_func,(wchar (*) [42])local_328);
        pcVar19 = Js::OpCodeUtil::GetOpCodeName
                            (*(OpCode *)(*(long *)instrIsInHelperBlockRef_local + 0x30));
        bVar3 = IR::Opnd::IsVar(_bailOutKind);
        pcVar24 = L"specialized";
        if (bVar3) {
          pcVar24 = L"not specialized";
        }
        Output::Print(L"Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."
                      ,pcVar17,pcVar18,pcVar19,local_2c8,pcVar24);
        Output::Print(L"\n");
        Output::Flush();
      }
    }
    IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&reg32);
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_138);
LAB_007a496e:
  if ((local_80 & 1) == 0) {
    labelFallThru->field_0x78 = labelFallThru->field_0x78 & 0xfd;
  }
  IR::Instr::InsertBefore(*(Instr **)instrIsInHelperBlockRef_local,&labelFallThru->super_Instr);
  *(undefined1 *)&(labelHelper->super_Instr)._vptr_Instr = 1;
  if ((local_7b & 1U) != 0) {
    bVar3 = IR::Instr::HasBailOutInfo(*(Instr **)instrIsInHelperBlockRef_local);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x48cc,"(ldElem->HasBailOutInfo())","ldElem->HasBailOutInfo()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    if (labelFallThru == labelMissingNative) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x48cd,"(labelHelper != labelBailOut)","labelHelper != labelBailOut");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    LowerOneBailOutKind(this,*(Instr **)instrIsInHelperBlockRef_local,
                        BailOutConventionalNativeArrayAccessOnly,
                        (bool)(*(byte *)&(labelHelper->super_Instr)._vptr_Instr & 1),false);
    _helperMethod = *(Instr **)(*(long *)instrIsInHelperBlockRef_local + 0x10);
    pPVar22 = IR::Instr::AsProfiledInstr(*(Instr **)instrIsInHelperBlockRef_local);
    local_33c.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         Js::LdElemInfo::GetElementType((pPVar22->u).ldElemInfo);
    local_339 = ValueType::HasBeenUndefined((ValueType *)&local_33c.field_0);
    if ((bool)local_339) {
      if ((labelCantUseArray._7_1_ & 1) == 0) {
        if (src1 == (Opnd *)0x0) {
          src1 = (Opnd *)IR::LabelInstr::New(Label,this->m_func,true);
          (((LabelInstr *)src1)->super_Instr).m_noLazyHelperAssert = true;
        }
        pOVar14 = IR::Instr::GetDst(*(Instr **)instrIsInHelperBlockRef_local);
        InsertMissingItemCompareBranch(this,pOVar14,BrEq_A,(LabelInstr *)src1,_helperMethod);
      }
      InsertBranch(Br,labelBailOut,_helperMethod);
      if (src1 != (Opnd *)0x0) {
        IR::Instr::InsertBefore(_helperMethod,(Instr *)src1);
        pOVar14 = IR::Instr::GetSrc1(*(Instr **)instrIsInHelperBlockRef_local);
        _emittedFastPath = IR::Opnd::AsIndirOpnd(pOVar14);
        pRVar13 = IR::IndirOpnd::GetBaseOpnd(_emittedFastPath);
        instrHelper._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&pRVar13->super_Opnd);
        bVar3 = ValueType::HasIntElements((ValueType *)((long)&instrHelper + 6));
        if (bVar3) {
          local_340 = HelperIntArr_ToVarArray;
        }
        else {
          pRVar13 = IR::IndirOpnd::GetBaseOpnd(_emittedFastPath);
          instrHelper._4_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(&pRVar13->super_Opnd);
          bVar3 = ValueType::HasFloatElements((ValueType *)((long)&instrHelper + 4));
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x4905,
                               "(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements())",
                               "indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements()");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          local_340 = HelperFloatArr_ToVarArray;
        }
        pIVar23 = _helperMethod;
        pRVar13 = IR::IndirOpnd::GetBaseOpnd(_emittedFastPath);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar23,&pRVar13->super_Opnd);
        pIVar23 = IR::Instr::New(Call,this->m_func);
        newSrc = IR::HelperCallOpnd::New(local_340,this->m_func);
        IR::Instr::SetSrc1(pIVar23,&newSrc->super_Opnd);
        IR::Instr::InsertBefore(_helperMethod,pIVar23);
        LowererMD::LowerCall(&this->m_lowererMD,pIVar23,0);
      }
    }
    else {
      if ((labelCantUseArray._7_1_ & 1) == 0) {
        pOVar14 = IR::Instr::GetDst(*(Instr **)instrIsInHelperBlockRef_local);
        InsertMissingItemCompareBranch(this,pOVar14,BrEq_A,labelMissingNative,_helperMethod);
      }
      InsertBranch(Br,labelBailOut,_helperMethod);
    }
    IR::Instr::InsertBefore(_helperMethod,&labelMissingNative->super_Instr);
  }
  if ((labelCantUseArray._7_1_ & 1) != 0) {
    IR::Instr::UnlinkSrc1(*(Instr **)instrIsInHelperBlockRef_local);
    IR::Instr::UnlinkDst(*(Instr **)instrIsInHelperBlockRef_local);
    GenerateBailOut(this,*(Instr **)instrIsInHelperBlockRef_local,(BranchInstr *)0x0,
                    (LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  return (bool)((labelCantUseArray._7_1_ ^ 0xff) & 1);
}

Assistant:

bool
Lowerer::GenerateFastLdElemI(IR::Instr *& ldElem, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    IR::LabelInstr *    labelHelper;
    IR::LabelInstr *    labelFallThru;
    IR::LabelInstr *    labelBailOut = nullptr;
    IR::LabelInstr *    labelMissingNative = nullptr;
    IR::Opnd *src1 =    ldElem->GetSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on LdElementI");

    IR::IndirOpnd *     indirOpnd = src1->AsIndirOpnd();

    // From FastElemICommon:
    //  TEST base, AtomTag                  -- check base not tagged int
    //  JNE $helper
    //  MOV r1, [base + offset(type)]       -- check base isArray
    //  CMP [r1 + offset(typeId)], TypeIds_Array
    //  JNE $helper
    //  TEST index, 1                       -- index tagged int
    //  JEQ $helper
    //  MOV r2, index
    //  SAR r2, Js::VarTag_Shift            -- remoe atom tag
    //  JS $helper                          -- exclude negative index
    //  MOV r4, [base + offset(head)]
    //  CMP r2, [r4 + offset(length)]       -- bounds check
    //  JAE $helper
    //  MOV r3, [r4 + offset(elements)]

    // Generated here:
    //  MOV dst, [r3 + r2]
    //  TEST dst, dst
    //  JNE $fallthrough

    if(ldElem->m_opcode == Js::OpCode::LdMethodElem && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray())
    {
        // Typed arrays don't return objects, so it's not worth generating a fast path for LdMethodElem. Calling the helper also
        // generates a better error message. Skip the fast path and just generate a helper call.
        return true;
    }

    labelFallThru = ldElem->GetOrCreateContinueLabel();
    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    // If we know for sure (based on flow graph) we're loading from the arguments object, then ignore the (path-based) profile info.
    bool isNativeArrayLoad = !ldElem->DoStackArgsOpt() && indirOpnd->GetBaseOpnd()->GetValueType().IsLikelyNativeArray();
    bool needMissingValueCheck = true;
    bool emittedFastPath = false;
    bool emitBailout = false;

    if (ldElem->DoStackArgsOpt())
    {
        emittedFastPath = GenerateFastArgumentsLdElemI(ldElem, labelFallThru);
        emitBailout = true;
    }
    else if (GenerateFastStringLdElem(ldElem, labelHelper, labelFallThru))
    {
        emittedFastPath = true;
    }
    else
    {
        IR::LabelInstr * labelCantUseArray = labelHelper;
        if (isNativeArrayLoad)
        {
            if (ldElem->GetDst()->GetType() == TyVar)
            {
                // Skip the fast path and just generate a helper call
                return true;
            }

            // Specialized native array lowering for LdElem requires that it is profiled. When not profiled, GlobOpt should not
            // have specialized it.
            Assert(ldElem->IsProfiledInstr());

            labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
            labelCantUseArray = labelBailOut;
        }
        Js::FldInfoFlags flags = Js::FldInfo_NoInfo;
        if (ldElem->IsProfiledInstr())
        {
            flags = ldElem->AsProfiledInstr()->u.ldElemInfo->flags;
        }
        bool isTypedArrayElement, isStringIndex, indirOpndOverflowed = false;
        IR::Opnd* maskOpnd = nullptr;
        indirOpnd =
            GenerateFastElemICommon(
                ldElem,
                false,
                src1->AsIndirOpnd(),
                labelHelper,
                labelCantUseArray,
                labelFallThru,
                &isTypedArrayElement,
                &isStringIndex,
                &emitBailout,
                &maskOpnd,
                nullptr,    /* pLabelSegmentLengthIncreased */
                true,       /* checkArrayLengthOverflow */
                false,      /* forceGenerateFastPath */
                false,      /* returnLength */
                nullptr,    /* bailOutLabelInstr */
                &indirOpndOverflowed,
                flags);

        IR::Opnd *dst = ldElem->GetDst();
        IRType dstType = dst->AsRegOpnd()->GetType();

        // The index is negative or not int.
        if (indirOpnd == nullptr)
        {
            // could have bailout kind BailOutOnArrayAccessHelperCall if indirOpnd overflows
            Assert(!(ldElem->HasBailOutInfo() && ldElem->GetBailOutKind() & IR::BailOutOnArrayAccessHelperCall) || indirOpndOverflowed);

            // don't check fast path without bailout because it might not be TypedArray
            if (indirOpndOverflowed && ldElem->HasBailOutInfo())
            {
                bool bailoutForOpndOverflow = false;
                const IR::BailOutKind bailOutKind = ldElem->GetBailOutKind();

                // return undefined for typed array if load dest is var, bailout otherwise
                if ((bailOutKind & ~IR::BailOutKindBits) == IR::BailOutConventionalTypedArrayAccessOnly)
                {
                    if (dst->IsVar())
                    {
                        // returns undefined in case of indirOpnd overflow which is consistent with behavior of interpreter
                        IR::Opnd * undefinedOpnd = this->LoadLibraryValueOpnd(ldElem, LibraryValue::ValueUndefined);
                        InsertMove(dst, undefinedOpnd, ldElem);

                        ldElem->FreeSrc1();
                        ldElem->FreeDst();
                        ldElem->Remove();

                        emittedFastPath = true;
                    }
                    else
                    {
                        bailoutForOpndOverflow = true;
                    }
                }

                if (bailoutForOpndOverflow || (bailOutKind & (IR::BailOutConventionalNativeArrayAccessOnly | IR::BailOutOnArrayAccessHelperCall)))
                {
                    IR::Opnd * constOpnd = nullptr;
                    if (dst->IsFloat())
                    {
                        constOpnd = IR::FloatConstOpnd::New(Js::JavascriptNumber::NaN, TyFloat64, m_func);
                    }
                    else
                    {
                        constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                    }
                    InsertMove(dst, constOpnd, ldElem);

                    ldElem->FreeSrc1();
                    ldElem->FreeDst();
                    GenerateBailOut(ldElem, nullptr, nullptr);
                    emittedFastPath = true;
                }

                return !emittedFastPath;
            }
            // The global optimizer should never type specialize a LdElem for which the index is not int or an integer constant
            // with a negative value. This would force an unconditional bail out on the main code path.
            else if (dst->IsVar())
            {
                if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("Typed Array Lowering: function: %s (%s): instr %s, not specialized by glob opt due to negative or not likely int index.\n"),
                        this->m_func->GetJITFunctionBody()->GetDisplayName(),
                        this->m_func->GetDebugNumberSet(debugStringBuffer),
                        Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode));
                    Output::Flush();
                }

                // We must be dealing with some unconventional index value.  Don't emit fast path, but go directly to helper.
                emittedFastPath = false;
                return true;
            }
            else
            {
                AssertMsg(false, "Global optimizer shouldn't have specialized this instruction.");
                Assert(dst->IsRegOpnd());

                // If global optimizer failed to notice the unconventional index and type specialized the dst,
                // there is nothing to do but bail out. This could happen if global optimizer's information based
                // on value tracking fails to recognize a non-integer index or a constant int index that is negative.
                // The bailout below ensures that we behave correctly in retail builds even under
                // these (unlikely) conditions. To satisfy the downstream code we must populate the type specialized operand
                // with some made up values, even though we will unconditionally bail out here and the values will never be
                // used.
                IR::IntConstOpnd *constOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func, true);
                InsertMove(dst, constOpnd, ldElem);

                ldElem->FreeSrc1();
                ldElem->FreeDst();
                GenerateBailOut(ldElem, nullptr, nullptr);
                return false;
            }
        }

        const IR::AutoReuseOpnd autoReuseIndirOpnd(indirOpnd, m_func);
        const ValueType baseValueType(src1->AsIndirOpnd()->GetBaseOpnd()->GetValueType());

        if ((ldElem->HasBailOutInfo() &&
                ldElem->GetByteCodeOffset() != Js::Constants::NoByteCodeOffset &&
                ldElem->GetBailOutInfo()->bailOutOffset <= ldElem->GetByteCodeOffset() &&
                dst->IsEqual(src1->AsIndirOpnd()->GetBaseOpnd())) ||
            (src1->AsIndirOpnd()->GetIndexOpnd() && dst->IsEqual(src1->AsIndirOpnd()->GetIndexOpnd())))
        {
            // This is a pre-op bailout where the dst is the same as one of the srcs. The dst may be trashed before bailing out,
            // but since the operation will be processed again in the interpreter, src values need to be kept intact. Use a
            // temporary dst until after the operation is complete.
            IR::Instr *instrSink = ldElem->SinkDst(Js::OpCode::Ld_A);

            // The sink instruction needs to be on the fall-through path
            instrSink->Unlink();
            labelFallThru->InsertAfter(instrSink);

            LowererMD::ChangeToAssign(instrSink);
            dst = ldElem->GetDst();
        }

        if (isTypedArrayElement)
        {
            // For typedArrays, convert the loaded element to the appropriate type
            IR::RegOpnd *reg;
            IR::AutoReuseOpnd autoReuseReg;

            Assert(dst->IsRegOpnd());

            if(indirOpnd->IsFloat())
            {
                AssertMsg((dstType == TyFloat64) || (dstType == TyVar), "For Float32Array LdElemI's dst should be specialized to TyFloat64 or not at all.");

                if(indirOpnd->IsFloat32())
                {
                    // MOVSS reg32.f32, indirOpnd.f32
                    IR::RegOpnd *reg32 = IR::RegOpnd::New(TyFloat32, this->m_func);
                    const IR::AutoReuseOpnd autoReuseReg32(reg32, m_func);
                    InsertMove(reg32, indirOpnd, ldElem);

                    // CVTPS2PD dst/reg.f64, reg32.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertConvertFloat32ToFloat64(reg, reg32, ldElem);
                }
                else
                {
                    Assert(indirOpnd->IsFloat64());

                    // MOVSD dst/reg.f64, indirOpnd.f64
                    reg = dstType == TyFloat64 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyFloat64, this->m_func);
                    autoReuseReg.Initialize(reg, m_func);
                    InsertMove(reg, indirOpnd, ldElem);
                }

                if (dstType != TyFloat64)
                {
                    // Convert reg.f64 to var
                    m_lowererMD.SaveDoubleToVar(dst->AsRegOpnd(), reg, ldElem, ldElem);
                }

#if FLOATVAR
                // For NaNs, go to the helper to guarantee we don't have an illegal NaN
                // TODO(magardn): move this to MD code.
#if _M_X64
                // UCOMISD reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::UCOMISD, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // JP $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::JP, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#elif _M_ARM64
                // FCMP reg, reg
                {
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::FCMP, this->m_func);
                    instr->SetSrc1(reg);
                    instr->SetSrc2(reg);
                    ldElem->InsertBefore(instr);
                }

                // BVS $helper
                {
                    IR::Instr *const instr = IR::BranchInstr::New(Js::OpCode::BVS, labelHelper, this->m_func);
                    ldElem->InsertBefore(instr);
                }
#endif
#endif

                if(dstType == TyFloat64)
                {
                    emitBailout = true;
                }
            }
            else
            {
                AssertMsg((dstType == TyInt32) || (dstType == TyVar), "For Int/UintArray LdElemI's dst should be specialized to TyInt32 or not at all.");

                reg = dstType == TyInt32 ? dst->AsRegOpnd() : IR::RegOpnd::New(TyInt32, this->m_func);
                autoReuseReg.Initialize(reg, m_func);

                // Int32 and Uint32 arrays could overflow an int31, but the others can't
                if (indirOpnd->GetType() != TyUint32
#if !INT32VAR
                    && indirOpnd->GetType() != TyInt32
#endif
                    )
                {
                    reg->SetValueType(ValueType::GetTaggedInt());  // Fits as a tagged-int
                }

                // MOV/MOVZX/MOVSX dst/reg.int32, IndirOpnd.type
                IR::Instr* instrMov = InsertMove(reg, indirOpnd, ldElem);
                if (maskOpnd)
                {
#if TARGET_64
                    if (maskOpnd->GetSize() != reg->GetType())
                    {
                        maskOpnd = maskOpnd->UseWithNewType(reg->GetType(), m_func)->AsRegOpnd();
                    }
#endif
                    instrMov = InsertAnd(reg, reg, maskOpnd, ldElem);
                }

                if (dstType == TyInt32)
                {
                    instrMov->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instrMov->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;

                    if (indirOpnd->GetType() == TyUint32)
                    {
                        // TEST dst, dst
                        // JSB $helper (bailout)
                        InsertCompareBranch(
                            reg,
                            IR::IntConstOpnd::New(0, TyUint32, this->m_func, /* dontEncode = */ true),
                            Js::OpCode::BrLt_A,
                            labelHelper,
                            ldElem);
                    }

                    emitBailout = true;
                }
                else
                {
                    // MOV dst, reg
                    IR::Instr *const instr = IR::Instr::New(Js::OpCode::ToVar, dst, reg, this->m_func);
                    instr->dstIsTempNumber = ldElem->dstIsTempNumber;
                    instr->dstIsTempNumberTransferred = ldElem->dstIsTempNumberTransferred;
                    ldElem->InsertBefore(instr);

                    // Convert dst to var
                    m_lowererMD.EmitLoadVar(instr, /* isFromUint32 = */ (indirOpnd->GetType() == TyUint32));
                }
            }

            //  JMP $fallthrough
            InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);

            emittedFastPath = true;

            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->m_func) && PHASE_TRACE(Js::LowererPhase, this->m_func))
            {
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                Output::Print(_u("Typed Array Lowering: function: %s (%s), instr: %s, base value type: %S, %s."),
                    this->m_func->GetJITFunctionBody()->GetDisplayName(),
                    this->m_func->GetDebugNumberSet(debugStringBuffer),
                    Js::OpCodeUtil::GetOpCodeName(ldElem->m_opcode),
                    baseValueTypeStr,
                    (!dst->IsVar() ? _u("specialized") : _u("not specialized")));
                Output::Print(_u("\n"));
                Output::Flush();
            }
        }
        else
        {
            // MOV dst, indirOpnd
            InsertMove(dst, indirOpnd, ldElem);
            if (maskOpnd)
            {
#if TARGET_64
                if (maskOpnd->GetSize() != dst->GetType())
                {
                    maskOpnd = maskOpnd->UseWithNewType(dst->GetType(), m_func)->AsRegOpnd();
                }
#endif
                InsertAnd(dst, dst, maskOpnd, ldElem);
            }

            // The string index fast path does not operate on index properties (we don't get a PropertyString in that case), so
            // we don't need to do any further checks in that case

            // For LdMethodElem, if the loaded value is a tagged number, the error message generated by the helper call is
            // better than if we were to just try to call the number. Also, the call arguments need to be evaluated before
            // throwing the error, so just test whether it's an object and jump to helper if it's not.
            const bool needObjectTest = !isStringIndex && !isNativeArrayLoad && ldElem->m_opcode == Js::OpCode::LdMethodElem;
            needMissingValueCheck =
                !isStringIndex && !(baseValueType.IsArrayOrObjectWithArray() && baseValueType.HasNoMissingValues());
            if(needMissingValueCheck)
            {
                //  TEST dst, dst
                //  JEQ $helper | JNE $fallthrough
                InsertMissingItemCompareBranch(
                    dst,
                    needObjectTest ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A,
                    needObjectTest ? labelHelper : labelFallThru,
                    ldElem);

                if (isNativeArrayLoad)
                {
                    Assert(!needObjectTest);
                    Assert(labelHelper != labelBailOut);
                    if(ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined())
                    {
                        // We're going to bail out trying to load "missing value" into a type-spec'd opnd.
                        // Branch to a point where we'll convert the array so that we don't keep bailing here.
                        // (Gappy arrays are not well-suited to nativeness.)
                        labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                        InsertBranch(Js::OpCode::Br, labelMissingNative, ldElem);
                    }
                    else
                    {
                        // If the value has not been profiled to be undefined at some point, jump directly to bail out
                        InsertBranch(Js::OpCode::Br, labelBailOut, ldElem);
                    }
                }
            }
            if(needObjectTest)
            {
                //  GenerateObjectTest(dst)
                //  JIsObject $fallthrough
                m_lowererMD.GenerateObjectTest(dst, ldElem, labelFallThru, true);
            }
            else if(!needMissingValueCheck)
            {
                //  JMP $fallthrough
                InsertBranch(Js::OpCode::Br, labelFallThru, ldElem);
            }

            emittedFastPath = true;
        }
    }
    // $helper:
    //      bailout or caller generated helper call
    // $fallthru:

    if (!emittedFastPath)
    {
        labelHelper->isOpHelper = false;
    }

    ldElem->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    if (isNativeArrayLoad)
    {
        Assert(ldElem->HasBailOutInfo());
        Assert(labelHelper != labelBailOut);

        // Transform the original instr:
        //
        // $helper:
        // dst = LdElemI_A src (BailOut)
        // $fallthrough:
        //
        // to:
        //
        // b $fallthru  <--- we get here if we loaded a valid element directly
        // $helper:
        // dst = LdElemI_A src
        // cmp dst, MissingItem
        // bne $fallthrough
        // $bailout:
        //       BailOut
        // $fallthrough:

        LowerOneBailOutKind(ldElem, IR::BailOutConventionalNativeArrayAccessOnly, instrIsInHelperBlock);
        IR::Instr *const insertBeforeInstr = ldElem->m_next;

        // Do missing value check on value returned from helper so that we don't have to check the index against
        // array length. (We already checked it above against the segment length.)

        bool hasBeenUndefined = ldElem->AsProfiledInstr()->u.ldElemInfo->GetElementType().HasBeenUndefined();
        if (hasBeenUndefined)
        {
            if(!emitBailout)
            {
                if (labelMissingNative == nullptr)
                {
                    labelMissingNative = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
#if DBG
                    labelMissingNative->m_noLazyHelperAssert = true;
#endif
                }

                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelMissingNative, insertBeforeInstr);
            }
            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
            if(labelMissingNative)
            {
                // We're going to bail out on a load from a gap, but convert the array to Var first, so we don't just
                // bail here over and over. Gappy arrays are not well suited to nativeness.
                // NOTE: only emit this call if the profile tells us that this has happened before ("hasBeenUndefined").
                // Emitting this in Navier-Stokes brutalizes the score.
                insertBeforeInstr->InsertBefore(labelMissingNative);
                IR::JnHelperMethod helperMethod;
                indirOpnd = ldElem->GetSrc1()->AsIndirOpnd();
                if (indirOpnd->GetBaseOpnd()->GetValueType().HasIntElements())
                {
                    helperMethod = IR::HelperIntArr_ToVarArray;
                }
                else
                {
                    Assert(indirOpnd->GetBaseOpnd()->GetValueType().HasFloatElements());
                    helperMethod = IR::HelperFloatArr_ToVarArray;
                }
                m_lowererMD.LoadHelperArgument(insertBeforeInstr, indirOpnd->GetBaseOpnd());
                IR::Instr *instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
                instrHelper->SetSrc1(IR::HelperCallOpnd::New(helperMethod, m_func));
                insertBeforeInstr->InsertBefore(instrHelper);
                m_lowererMD.LowerCall(instrHelper, 0);
            }
        }
        else
        {
            if(!emitBailout)
            {
                InsertMissingItemCompareBranch(ldElem->GetDst(), Js::OpCode::BrEq_A, labelBailOut, insertBeforeInstr);
            }

            InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
        }

        insertBeforeInstr->InsertBefore(labelBailOut);
    }

    if (emitBailout)
    {
        ldElem->UnlinkSrc1();
        ldElem->UnlinkDst();
        GenerateBailOut(ldElem, nullptr, nullptr);
    }

    return !emitBailout;
}